

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O1

CommandSignature * __thiscall
llbuild::basic::CommandSignature::combine<std::__cxx11::string>
          (CommandSignature *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list)

{
  pointer pbVar1;
  hash_code hVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  pointer arg;
  hash_combine_recursive_helper local_b0;
  
  arg = (list->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (list->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (arg != pbVar1) {
    do {
      llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_b0)
      ;
      local_b0.buffer._0_8_ = this->value;
      hVar2 = llvm::hashing::detail::hash_combine_recursive_helper::combine<std::__cxx11::string>
                        (&local_b0,0,local_b0.buffer + 8,(char *)&local_b0.state,arg);
      this->value = hVar2.value;
      arg = arg + 1;
    } while (arg != pbVar1);
  }
  return this;
}

Assistant:

CommandSignature& combine(const std::vector<T>& list) {
    for (const auto& v: list) {
      combine(v);
    }
    return *this;
  }